

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O0

void test_bhdct_delete_all_string_key(planck_unit_test_t *tc)

{
  uint local_88;
  char local_81;
  int i;
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  planck_unit_test_t *tc_local;
  
  memset(&local_81,0,9);
  bhdct_setup_string_key
            (tc,(ion_dictionary_handler_t *)&dict.handler,(ion_dictionary_t *)(key + 1),
             ion_fill_edge_cases);
  for (local_88 = 0; (int)local_88 < 10; local_88 = local_88 + 1) {
    sprintf(&local_81,"k%d",(ulong)local_88);
    bhdct_delete(tc,(ion_dictionary_t *)(key + 1),&local_81,'\0',1,'\x01');
  }
  for (local_88 = 0x32; (int)local_88 < 100; local_88 = local_88 + 2) {
    sprintf(&local_81,"k%d",(ulong)local_88);
    bhdct_delete(tc,(ion_dictionary_t *)(key + 1),&local_81,'\0',1,'\x01');
  }
  for (local_88 = 500; (int)local_88 < 1000; local_88 = local_88 + 5) {
    sprintf(&local_81,"k%d",(ulong)local_88);
    bhdct_delete(tc,(ion_dictionary_t *)(key + 1),&local_81,'\0',1,'\x01');
  }
  for (local_88 = 0xffffff9c; (int)local_88 < -0x32; local_88 = local_88 + 2) {
    sprintf(&local_81,"k%d",(ulong)local_88);
    bhdct_delete(tc,(ion_dictionary_t *)(key + 1),&local_81,'\0',1,'\x01');
  }
  bhdct_takedown(tc,(ion_dictionary_t *)(key + 1));
  return;
}

Assistant:

void
test_bhdct_delete_all_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_edge_cases);

	int i;

	ION_FILL_LOW_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_delete(tc, &dict, key, err_ok, 1, boolean_true);
	}
	ION_FILL_MEDIUM_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_delete(tc, &dict, key, err_ok, 1, boolean_true);
	}
	ION_FILL_HIGH_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_delete(tc, &dict, key, err_ok, 1, boolean_true);
	}
	ION_FILL_EDGE_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_delete(tc, &dict, key, err_ok, 1, boolean_true);
	}

	bhdct_takedown(tc, &dict);
}